

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O1

void __thiscall
ktx::CommandExtract::OptionsExtract::process
          (OptionsExtract *this,Options *param_1,ParseResult *args,Reporter *report)

{
  pointer pcVar1;
  pointer pHVar2;
  pointer pHVar3;
  pointer pHVar4;
  bool bVar5;
  int iVar6;
  const_iterator __end2;
  size_t sVar7;
  OptionValue *pOVar8;
  bool *pbVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  bool *found;
  pointer pHVar11;
  string_view str;
  optional<ktx::SelectorRange> level;
  optional<ktx::SelectorRange> depth_;
  optional<ktx::SelectorRange> face;
  optional<ktx::SelectorRange> layer;
  anon_class_16_2_501fead0 parseSelector;
  string local_148;
  undefined1 local_128 [24];
  undefined8 local_110 [2];
  pointer local_100;
  pointer local_f8;
  pointer local_e8;
  allocator<char> local_d1;
  _Storage<ktx::SelectorRange,_false> local_d0;
  char local_b8;
  _Storage<ktx::SelectorRange,_false> local_b0;
  char local_98;
  _Storage<ktx::SelectorRange,_false> local_90;
  char local_78;
  _Storage<ktx::SelectorRange,_false> local_70;
  char local_58;
  anon_class_16_2_501fead0 local_50;
  bool *local_40;
  bool *local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,kOutput,(allocator<char> *)&local_d0._M_value);
  sVar7 = cxxopts::ParseResult::count(args,(string *)local_128);
  pcVar1 = local_128 + 0x10;
  if ((pointer)local_128._0_8_ != pcVar1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  if (sVar7 == 0) {
    Reporter::fatal_usage<char_const(&)[39]>
              (report,(char (*) [39])"Missing output file or directory path.");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_128,kOutput,(allocator<char> *)&local_d0._M_value);
    pOVar8 = cxxopts::ParseResult::operator[](args,(string *)local_128);
    cxxopts::OptionValue::as<std::__cxx11::string>(pOVar8);
    std::__cxx11::string::_M_assign((string *)this);
    if ((pointer)local_128._0_8_ != pcVar1) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
  }
  local_50.args = args;
  local_50.report = report;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,kLevel,(allocator<char> *)&local_70._M_value);
  process::anon_class_16_2_501fead0::operator()
            ((optional<ktx::SelectorRange> *)&local_d0._M_value,&local_50,(string *)local_128,
             &this->levelFlagUsed);
  if ((pointer)local_128._0_8_ != pcVar1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,kLayer,(allocator<char> *)&local_90._M_value);
  local_38 = &this->layerFlagUsed;
  process::anon_class_16_2_501fead0::operator()
            ((optional<ktx::SelectorRange> *)&local_70._M_value,&local_50,(string *)local_128,
             local_38);
  if ((pointer)local_128._0_8_ != pcVar1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,kFace,(allocator<char> *)&local_b0._M_value);
  local_40 = &this->faceFlagUsed;
  process::anon_class_16_2_501fead0::operator()
            ((optional<ktx::SelectorRange> *)&local_90._M_value,&local_50,(string *)local_128,
             local_40);
  if ((pointer)local_128._0_8_ != pcVar1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,kDepth,(allocator<char> *)&local_148);
  found = &this->depthFlagUsed;
  process::anon_class_16_2_501fead0::operator()
            ((optional<ktx::SelectorRange> *)&local_b0._M_value,&local_50,(string *)local_128,found)
  ;
  if ((pointer)local_128._0_8_ != pcVar1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,kRaw,(allocator<char> *)&local_148);
  pOVar8 = cxxopts::ParseResult::operator[](args,(string *)local_128);
  pbVar9 = cxxopts::OptionValue::as<bool>(pOVar8);
  this->raw = *pbVar9;
  if ((pointer)local_128._0_8_ != pcVar1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,kAll,(allocator<char> *)&local_148);
  pOVar8 = cxxopts::ParseResult::operator[](args,(string *)local_128);
  pbVar9 = cxxopts::OptionValue::as<bool>(pOVar8);
  this->globalAll = *pbVar9;
  if ((pointer)local_128._0_8_ != pcVar1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  if (this->globalAll == true) {
    if (local_b8 == '\x01') {
      Reporter::fatal_usage<char_const(&)[56]>
                (report,(char (*) [56])"Conflicting options: --level cannot be used with --all.");
    }
    if (local_58 == '\x01') {
      Reporter::fatal_usage<char_const(&)[56]>
                (report,(char (*) [56])"Conflicting options: --layer cannot be used with --all.");
    }
    if (local_78 == '\x01') {
      Reporter::fatal_usage<char_const(&)[55]>
                (report,(char (*) [55])"Conflicting options: --face cannot be used with --all.");
    }
    if (local_98 == '\x01') {
      Reporter::fatal_usage<char_const(&)[56]>
                (report,(char (*) [56])"Conflicting options: --depth cannot be used with --all.");
    }
    std::optional<ktx::SelectorRange>::operator=
              ((optional<ktx::SelectorRange> *)&local_d0._M_value,(All_t *)&all);
    std::optional<ktx::SelectorRange>::operator=
              ((optional<ktx::SelectorRange> *)&local_70._M_value,(All_t *)&all);
    std::optional<ktx::SelectorRange>::operator=
              ((optional<ktx::SelectorRange> *)&local_90._M_value,(All_t *)&all);
    std::optional<ktx::SelectorRange>::operator=
              ((optional<ktx::SelectorRange> *)&local_b0._M_value,(All_t *)&all);
  }
  if ((this->globalAll == true) && (iVar6 = std::__cxx11::string::compare((char *)this), iVar6 == 0)
     ) {
    Reporter::fatal_usage<char_const(&)[57]>
              (report,(char (*) [57])"stdout cannot be used with multi-output \'--all\' extract.");
  }
  if (((local_b8 == '\x01') && (bVar5 = operator==(&local_d0), bVar5)) &&
     (iVar6 = std::__cxx11::string::compare((char *)this), iVar6 == 0)) {
    Reporter::fatal_usage<char_const(&)[63]>
              (report,(char (*) [63])
                      "stdout cannot be used with multi-output \'--level all\' extract.");
  }
  if (((local_58 == '\x01') && (bVar5 = operator==(&local_70), bVar5)) &&
     (iVar6 = std::__cxx11::string::compare((char *)this), iVar6 == 0)) {
    Reporter::fatal_usage<char_const(&)[63]>
              (report,(char (*) [63])
                      "stdout cannot be used with multi-output \'--layer all\' extract.");
  }
  if (((local_78 == '\x01') && (bVar5 = operator==(&local_90), bVar5)) &&
     (iVar6 = std::__cxx11::string::compare((char *)this), iVar6 == 0)) {
    Reporter::fatal_usage<char_const(&)[62]>
              (report,(char (*) [62])
                      "stdout cannot be used with multi-output \'--face all\' extract.");
  }
  if (((local_98 == '\x01') && (bVar5 = operator==(&local_b0), bVar5)) &&
     (iVar6 = std::__cxx11::string::compare((char *)this), iVar6 == 0)) {
    Reporter::fatal_usage<char_const(&)[63]>
              (report,(char (*) [63])
                      "stdout cannot be used with multi-output \'--depth all\' extract.");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,kUri,(allocator<char> *)&local_148);
  pOVar8 = cxxopts::ParseResult::operator[](args,(string *)local_128);
  sVar7 = pOVar8->m_count;
  if ((pointer)local_128._0_8_ != pcVar1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  if (sVar7 == 0) {
    SelectorRange::SelectorRange((SelectorRange *)&local_148,0,1);
    if (local_b8 == '\x01') {
      std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
      vector((vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
              *)local_128,&local_d0._M_value.ranges);
    }
    else {
      local_128._0_8_ = local_148._M_dataplus._M_p;
      local_128._8_8_ = local_148._M_string_length;
      local_128._16_8_ = local_148.field_2._M_allocated_capacity;
      local_148._M_dataplus._M_p = (pointer)0x0;
      local_148._M_string_length = 0;
      local_148.field_2._M_allocated_capacity = 0;
    }
    std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
    _M_move_assign((vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                    *)&this->fragmentURI);
    if ((pointer)local_128._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
    }
    if (local_148._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_148._M_dataplus._M_p,
                      local_148.field_2._M_allocated_capacity - (long)local_148._M_dataplus._M_p);
    }
    SelectorRange::SelectorRange((SelectorRange *)&local_148,0,1);
    if (local_58 == '\x01') {
      std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
      vector((vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
              *)local_128,&local_70._M_value.ranges);
    }
    else {
      local_128._0_8_ = local_148._M_dataplus._M_p;
      local_128._8_8_ = local_148._M_string_length;
      local_128._16_8_ = local_148.field_2._M_allocated_capacity;
      local_148._M_dataplus._M_p = (pointer)0x0;
      local_148._M_string_length = 0;
      local_148.field_2._M_allocated_capacity = 0;
    }
    std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
    _M_move_assign(&(this->fragmentURI).stratal.ranges);
    if ((pointer)local_128._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
    }
    if (local_148._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_148._M_dataplus._M_p,
                      local_148.field_2._M_allocated_capacity - (long)local_148._M_dataplus._M_p);
    }
    SelectorRange::SelectorRange((SelectorRange *)&local_148,0,1);
    if (local_78 == '\x01') {
      std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
      vector((vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
              *)local_128,&local_90._M_value.ranges);
    }
    else {
      local_128._0_8_ = local_148._M_dataplus._M_p;
      local_128._8_8_ = local_148._M_string_length;
      local_128._16_8_ = local_148.field_2._M_allocated_capacity;
      local_148._M_dataplus._M_p = (pointer)0x0;
      local_148._M_string_length = 0;
      local_148.field_2._M_allocated_capacity = 0;
    }
    std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
    _M_move_assign(&(this->fragmentURI).facial.ranges);
    if ((pointer)local_128._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
    }
    if (local_148._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_148._M_dataplus._M_p,
                      local_148.field_2._M_allocated_capacity - (long)local_148._M_dataplus._M_p);
    }
  }
  else {
    this->uriFlagUsed = true;
    if (this->globalAll == true) {
      Reporter::fatal_usage<char_const(&)[54]>
                (report,(char (*) [54])"Conflicting options: --all cannot be used with --uri.");
    }
    if (this->levelFlagUsed == true) {
      Reporter::fatal_usage<char_const(&)[56]>
                (report,(char (*) [56])"Conflicting options: --level cannot be used with --uri.");
    }
    if (*local_38 == true) {
      Reporter::fatal_usage<char_const(&)[56]>
                (report,(char (*) [56])"Conflicting options: --layer cannot be used with --uri.");
    }
    if (*local_40 == true) {
      Reporter::fatal_usage<char_const(&)[55]>
                (report,(char (*) [55])"Conflicting options: --face cannot be used with --uri.");
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,kUri,&local_d1);
    pOVar8 = cxxopts::ParseResult::operator[](args,&local_148);
    pbVar10 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar8);
    str._M_str = found;
    str._M_len = (size_t)(pbVar10->_M_dataplus)._M_p;
    parseFragmentURI((FragmentURI *)local_128,(ktx *)pbVar10->_M_string_length,str);
    std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
    _M_move_assign((vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                    *)&this->fragmentURI,local_128);
    std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
    _M_move_assign(&(this->fragmentURI).stratal.ranges,local_110);
    std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
    _M_move_assign(&(this->fragmentURI).facial.ranges);
    if (local_f8 != (pointer)0x0) {
      operator_delete(local_f8,(long)local_e8 - (long)local_f8);
    }
    if ((void *)local_110[0] != (void *)0x0) {
      operator_delete((void *)local_110[0],(long)local_100 - local_110[0]);
    }
    if ((pointer)local_128._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    pHVar2 = (this->fragmentURI).mip.ranges.
             super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pHVar3 = (this->fragmentURI).mip.ranges.
             super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pHVar2 == pHVar3) {
LAB_0018dad4:
      pHVar2 = (this->fragmentURI).stratal.ranges.
               super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pHVar3 = (this->fragmentURI).stratal.ranges.
               super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pHVar2 == pHVar3) {
LAB_0018db01:
        pHVar2 = (this->fragmentURI).facial.ranges.
                 super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pHVar3 = (this->fragmentURI).facial.ranges.
                 super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pHVar2 == pHVar3) goto LAB_0018dcd6;
        pHVar4 = pHVar2;
        do {
          pHVar11 = pHVar4 + 1;
          if (pHVar4->end != pHVar2->begin + 1) break;
          if (pHVar11 == pHVar3) goto LAB_0018dcd6;
          pHVar4 = pHVar11;
        } while (pHVar11->begin == pHVar2->begin);
      }
      else {
        pHVar4 = pHVar2;
        do {
          pHVar11 = pHVar4 + 1;
          if (pHVar4->end != pHVar2->begin + 1) break;
          if (pHVar11 == pHVar3) goto LAB_0018db01;
          pHVar4 = pHVar11;
        } while (pHVar11->begin == pHVar2->begin);
      }
    }
    else {
      pHVar4 = pHVar2;
      do {
        pHVar11 = pHVar4 + 1;
        if (pHVar4->end != pHVar2->begin + 1) break;
        if (pHVar11 == pHVar3) goto LAB_0018dad4;
        pHVar4 = pHVar11;
      } while (pHVar11->begin == pHVar2->begin);
    }
    iVar6 = std::__cxx11::string::compare((char *)this);
    if (iVar6 == 0) {
      Reporter::fatal_usage<char_const(&)[57]>
                (report,(char (*) [57])"stdout cannot be used with multi-output \'--uri\' extract.")
      ;
    }
  }
LAB_0018dcd6:
  SelectorRange::SelectorRange((SelectorRange *)&local_148,0,1);
  if (local_98 == '\x01') {
    std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
    vector((vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_> *)
           local_128,&local_b0._M_value.ranges);
  }
  else {
    local_128._0_8_ = local_148._M_dataplus._M_p;
    local_128._8_8_ = local_148._M_string_length;
    local_128._16_8_ = local_148.field_2._M_allocated_capacity;
    local_148._M_dataplus._M_p = (pointer)0x0;
    local_148._M_string_length = 0;
    local_148.field_2._M_allocated_capacity = 0;
  }
  std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
  _M_move_assign(&(this->depth).ranges,local_128);
  if ((pointer)local_128._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
  }
  if (local_148._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_148._M_dataplus._M_p,
                    local_148.field_2._M_allocated_capacity - (long)local_148._M_dataplus._M_p);
  }
  if ((local_98 == '\x01') &&
     (local_98 = '\0',
     local_b0._M_value.ranges.
     super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
     ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_b0._M_value.ranges.
                    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0._M_value.ranges.
                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage - local_b0._0_8_);
  }
  if ((local_78 == '\x01') &&
     (local_78 = '\0',
     local_90._M_value.ranges.
     super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
     ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_90._M_value.ranges.
                    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90._M_value.ranges.
                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage - local_90._0_8_);
  }
  if ((local_58 == '\x01') &&
     (local_58 = '\0',
     local_70._M_value.ranges.
     super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
     ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_70._M_value.ranges.
                    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70._M_value.ranges.
                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage - local_70._0_8_);
  }
  if ((local_b8 == '\x01') &&
     (local_b8 = 0,
     local_d0._M_value.ranges.
     super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
     ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_d0._M_value.ranges.
                    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0._M_value.ranges.
                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage - local_d0._0_8_);
  }
  return;
}

Assistant:

void CommandExtract::OptionsExtract::process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
    if (args.count(kOutput))
        outputPath = args[kOutput].as<std::string>();
    else
        report.fatal_usage("Missing output file or directory path.");

    const auto parseSelector = [&](const std::string& name, bool& found) -> std::optional<SelectorRange> {
        if (!args[name].count())
            return std::nullopt;
        const auto str = to_lower_copy(args[name].as<std::string>());
        try {
            found = true;
            return str == kAll ? SelectorRange(all) : SelectorRange(std::stoi(str));
        } catch (const std::invalid_argument&) {
            report.fatal_usage("Invalid {} value \"{}\". The value must be a either a number or \"all\".", name, str);
        } catch (const std::out_of_range& e) {
            report.fatal_usage("Out of range {} value \"{}\": {}.", name, str, e.what());
        }
        return std::nullopt;
    };

    auto level = parseSelector(kLevel, levelFlagUsed);
    auto layer = parseSelector(kLayer, layerFlagUsed);
    auto face = parseSelector(kFace, faceFlagUsed);
    auto depth_ = parseSelector(kDepth, depthFlagUsed);
    raw = args[kRaw].as<bool>();
    globalAll = args[kAll].as<bool>();

    if (globalAll) {
        if (level)
            report.fatal_usage("Conflicting options: --level cannot be used with --all.");
        if (layer)
            report.fatal_usage("Conflicting options: --layer cannot be used with --all.");
        if (face)
            report.fatal_usage("Conflicting options: --face cannot be used with --all.");
        if (depth_)
            report.fatal_usage("Conflicting options: --depth cannot be used with --all.");

        level = all;
        layer = all;
        face = all;
        depth_ = all;
    }

    if (globalAll && outputPath == "-")
        report.fatal_usage("stdout cannot be used with multi-output '--all' extract.");
    if (level == all && outputPath == "-")
        report.fatal_usage("stdout cannot be used with multi-output '--level all' extract.");
    if (layer == all && outputPath == "-")
        report.fatal_usage("stdout cannot be used with multi-output '--layer all' extract.");
    if (face == all && outputPath == "-")
        report.fatal_usage("stdout cannot be used with multi-output '--face all' extract.");
    if (depth_ == all && outputPath == "-")
        report.fatal_usage("stdout cannot be used with multi-output '--depth all' extract.");

    if (args[kUri].count()) {
        uriFlagUsed = true;

        if (globalAll)
            report.fatal_usage("Conflicting options: --all cannot be used with --uri.");
        if (levelFlagUsed)
            report.fatal_usage("Conflicting options: --level cannot be used with --uri.");
        if (layerFlagUsed)
            report.fatal_usage("Conflicting options: --layer cannot be used with --uri.");
        if (faceFlagUsed)
            report.fatal_usage("Conflicting options: --face cannot be used with --uri.");

        try {
            fragmentURI = parseFragmentURI(args[kUri].as<std::string>());
        } catch (const std::exception& e) {
            report.fatal_usage("Failed to parse Fragment URI: {}", e.what());
        }

        const auto isMultiOutputFragmentURI =
                (!fragmentURI.mip.is_undefined() && fragmentURI.mip.is_multi()) ||
                (!fragmentURI.stratal.is_undefined() && fragmentURI.stratal.is_multi()) ||
                (!fragmentURI.facial.is_undefined() && fragmentURI.facial.is_multi());
        if (isMultiOutputFragmentURI && outputPath == "-")
            report.fatal_usage("stdout cannot be used with multi-output '--uri' extract.");

    } else {
        // Merge every other selection method into the fragmentURI
        fragmentURI.mip = level.value_or(SelectorRange(0));
        fragmentURI.stratal = layer.value_or(SelectorRange(0));
        fragmentURI.facial = face.value_or(SelectorRange(0));
    }

    this->depth = depth_.value_or(SelectorRange(0));
}